

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O3

FStartupScreen * FStartupScreen::CreateInstance(int max_progress)

{
  FStartupScreen *this;
  
  addterm(DeleteStartupScreen,"DeleteStartupScreen");
  this = (FStartupScreen *)operator_new(0x68);
  FStartupScreen(this,max_progress);
  this->_vptr_FStartupScreen = (_func_int **)&PTR__FTTYStartupScreen_006ea988;
  this->field_0x14 = 0;
  this[1]._vptr_FStartupScreen = (_func_int **)0x0;
  this[1].MaxPos = 0;
  this[1].CurPos = 0;
  return this;
}

Assistant:

FStartupScreen *FStartupScreen::CreateInstance(int max_progress)
{
	atterm(DeleteStartupScreen);
	return new FTTYStartupScreen(max_progress);
}